

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::start(torrent *this)

{
  byte bVar1;
  add_torrent_params *paVar2;
  pointer pbVar3;
  peer_list *ppVar4;
  undefined8 uVar5;
  pointer pcVar6;
  uint3 uVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  ulong uVar10;
  uint uVar11;
  char *pcVar12;
  pointer pbVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  EVP_PKEY_CTX *ctx;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  basic_endpoint<boost::asio::ip::tcp> *peer;
  char *pcVar23;
  bool bVar24;
  string local_d8;
  string str;
  address local_50;
  
  paVar2 = (this->m_add_torrent_params)._M_t.
           super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
           .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
  if (paVar2 != (add_torrent_params *)0x0) {
    uVar9 = 0xffffff;
    if (0 < paVar2->max_uploads) {
      uVar9 = paVar2->max_uploads;
    }
    if (uVar9 != *(uint3 *)&this->field_0x5d4) {
      *(short *)&this->field_0x5d4 = (short)uVar9;
      this->field_0x5d6 = (char)(uVar9 >> 0x10);
      (*(this->super_request_callback)._vptr_request_callback[6])(this);
    }
    set_max_connections(this,paVar2->max_connections,false);
    set_limit_impl(this,paVar2->upload_limit,0,false);
    set_limit_impl(this,paVar2->download_limit,1,false);
    pbVar13 = *(pointer *)
               &(paVar2->peers).
                super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                ._M_impl;
    pbVar3 = (paVar2->peers).
             super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar13 != pbVar3) {
      do {
        add_peer(this,pbVar13,(peer_source_flags_t)0x10,(pex_flags_t)0x0);
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 != pbVar3);
      if (*(pointer *)
           &(paVar2->peers).
            super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
            ._M_impl !=
          (paVar2->peers).
          super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do_connect_boost(this);
      }
    }
    iVar8 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
    if ((char)iVar8 != '\0') {
      pbVar13 = *(pointer *)
                 &(paVar2->peers).
                  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                  ._M_impl;
      pbVar3 = (paVar2->peers).
               super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar13 != pbVar3) {
        str._M_dataplus._M_p = (pointer)&str.field_2;
        str._M_string_length = 0;
        str.field_2._M_local_buf[0] = '\0';
        do {
          bVar24 = *(short *)&(pbVar13->impl_).data_ != 2;
          if (bVar24) {
            local_50.ipv6_address_.addr_.__in6_u._0_8_ =
                 *(undefined8 *)((long)&(pbVar13->impl_).data_ + 8);
            local_50.ipv6_address_.addr_.__in6_u._8_8_ =
                 *(undefined8 *)((long)&(pbVar13->impl_).data_ + 0x10);
            local_50.ipv6_address_.scope_id_ =
                 (unsigned_long)(pbVar13->impl_).data_.v6.sin6_scope_id;
            local_50.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
          }
          else {
            local_50.ipv4_address_.addr_.s_addr =
                 (in4_addr_type)(pbVar13->impl_).data_.v4.sin_addr.s_addr;
            local_50.ipv6_address_.addr_.__in6_u._0_8_ = 0;
            local_50.ipv6_address_.addr_.__in6_u._8_8_ = 0;
            local_50.ipv6_address_.scope_id_ = 0;
          }
          local_50.type_ = (anon_enum_32)bVar24;
          boost::asio::ip::address::to_string_abi_cxx11_(&local_d8,&local_50);
          ::std::__cxx11::string::_M_append((char *)&str,(ulong)local_d8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::string::push_back((char)&str);
          pbVar13 = pbVar13 + 1;
        } while (pbVar13 != pbVar3);
        ppVar4 = (this->super_torrent_hot_members).m_peer_list._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                 .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
        if (ppVar4 == (peer_list *)0x0) {
          uVar10 = 0xffffffff;
        }
        else {
          uVar10 = (ulong)(uint)ppVar4->m_num_connect_candidates;
        }
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"add_torrent add_peer() [ %s] connect-candidates: %d",str._M_dataplus._M_p,
                   uVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p,
                          CONCAT71(str.field_2._M_allocated_capacity._1_7_,
                                   str.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  iVar8 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
  if ((char)iVar8 != '\0') {
    uVar5 = *(undefined8 *)&(this->super_torrent_hot_members).field_0x48;
    pcVar6 = (((this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_files).m_name._M_dataplus._M_p;
    uVar7 = *(uint3 *)&this->field_0x5d4;
    uVar9 = limit_impl(this,0);
    iVar8 = limit_impl(this,1);
    bVar1 = this->field_0x5cc;
    pcVar19 = "";
    pcVar12 = "seed-mode ";
    if ((bVar1 & 4) == 0) {
      pcVar12 = "";
    }
    uVar10 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
    uVar11 = (uint)uVar10;
    pcVar14 = "upload-mode ";
    if ((uVar11 >> 0x18 & 1) == 0) {
      pcVar14 = "";
    }
    pcVar15 = "share-mode ";
    if ((uVar11 >> 0x1d & 1) == 0) {
      pcVar15 = "";
    }
    pcVar16 = "apply-ip-filter ";
    if ((this->field_0x5db & 2) == 0) {
      pcVar16 = "";
    }
    pcVar17 = "paused ";
    if ((uVar11 >> 0x1b & 1) == 0) {
      pcVar17 = "";
    }
    pcVar18 = "auto-managed ";
    if ((this->field_0x600 & 1) == 0) {
      pcVar18 = "";
    }
    pcVar23 = "update-subscribe ";
    if ((uVar10 >> 0x20 & 1) == 0) {
      pcVar23 = "";
    }
    pcVar21 = "super-seeding ";
    if ((bVar1 & 8) == 0) {
      pcVar21 = "";
    }
    pcVar20 = "sequential-download ";
    if ((bVar1 & 1) == 0) {
      pcVar20 = "";
    }
    paVar2 = (this->m_add_torrent_params)._M_t.
             super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
             .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
    pcVar22 = "";
    if (paVar2 != (add_torrent_params *)0x0) {
      uVar11 = (uint)(paVar2->flags).m_val;
      pcVar19 = "override-trackers ";
      if ((uVar11 >> 0xb & 1) == 0) {
        pcVar19 = "";
      }
      pcVar22 = "override-web-seeds ";
      if ((uVar11 >> 0xc & 1) == 0) {
        pcVar22 = "";
      }
    }
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,
               "creating torrent: %s max-uploads: %d max-connections: %d upload-limit: %d download-limit: %d flags: %s%s%s%s%s%s%s%s%s%s%s save-path: %s"
               ,pcVar6,(ulong)uVar7,(ulong)((uint)((ulong)uVar5 >> 0x21) & 0xffffff),(ulong)uVar9,
               CONCAT44(extraout_var,iVar8),pcVar12,pcVar14,pcVar15,pcVar16,pcVar17,pcVar18,pcVar23,
               pcVar21,pcVar20,pcVar19,pcVar22,(this->m_save_path)._M_dataplus._M_p);
  }
  update_gauge(this);
  update_want_peers(this);
  update_want_scrape(this);
  bVar24 = want_tick(this);
  ctx = (EVP_PKEY_CTX *)0x1;
  update_list(this,(torrent_list_index_t)0x1,bVar24);
  update_state_list(this);
  if ((((this->super_torrent_hot_members).m_torrent_file.
        super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files).
      m_piece_length < 1) {
    set_state(this,downloading_metadata);
    start_announcing(this);
  }
  else {
    init(this,ctx);
  }
  return;
}

Assistant:

void torrent::start()
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(m_was_started == false);
#if TORRENT_USE_ASSERTS
		m_was_started = true;
#endif

		// Some of these calls may log to the torrent debug log, which requires a
		// call to get_handle(), which requires the torrent object to be fully
		// constructed, as it relies on get_shared_from_this()
		if (m_add_torrent_params)
		{
#if TORRENT_ABI_VERSION == 1
			if (m_add_torrent_params->internal_resume_data_error
				&& m_ses.alerts().should_post<fastresume_rejected_alert>())
			{
				m_ses.alerts().emplace_alert<fastresume_rejected_alert>(get_handle()
					, m_add_torrent_params->internal_resume_data_error, ""
					, operation_t::unknown);
			}
#endif

			add_torrent_params const& p = *m_add_torrent_params;

			set_max_uploads(p.max_uploads, false);
			set_max_connections(p.max_connections, false);
			set_limit_impl(p.upload_limit, peer_connection::upload_channel, false);
			set_limit_impl(p.download_limit, peer_connection::download_channel, false);

			for (auto const& peer : p.peers)
			{
				add_peer(peer, peer_info::resume_data);
			}

			if (!p.peers.empty())
			{
				do_connect_boost();
			}

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log() && !p.peers.empty())
			{
				std::string str;
				for (auto const& peer : p.peers)
				{
					str += peer.address().to_string();
					str += ' ';
				}
				debug_log("add_torrent add_peer() [ %s] connect-candidates: %d"
					, str.c_str(), m_peer_list
					? m_peer_list->num_connect_candidates() : -1);
			}
#endif
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("creating torrent: %s max-uploads: %d max-connections: %d "
				"upload-limit: %d download-limit: %d flags: %s%s%s%s%s%s%s%s%s%s%s "
				"save-path: %s"
				, torrent_file().name().c_str()
				, int(m_max_uploads)
				, int(m_max_connections)
				, upload_limit()
				, download_limit()
				, m_seed_mode ? "seed-mode " : ""
				, m_upload_mode ? "upload-mode " : ""
#ifndef TORRENT_DISABLE_SHARE_MODE
				, m_share_mode ? "share-mode " : ""
#else
				, ""
#endif
				, m_apply_ip_filter ? "apply-ip-filter " : ""
				, m_paused ? "paused " : ""
				, m_auto_managed ? "auto-managed " : ""
				, m_state_subscription ? "update-subscribe " : ""
#ifndef TORRENT_DISABLE_SUPERSEEDING
				, m_super_seeding ? "super-seeding " : ""
#else
				, ""
#endif
				, m_sequential_download ? "sequential-download " : ""
				, (m_add_torrent_params && m_add_torrent_params->flags & torrent_flags::deprecated_override_trackers)
					? "override-trackers "  : ""
				, (m_add_torrent_params && m_add_torrent_params->flags & torrent_flags::deprecated_override_web_seeds)
					? "override-web-seeds " : ""
				, m_save_path.c_str()
				);
		}
#endif

		update_gauge();

		update_want_peers();
		update_want_scrape();
		update_want_tick();
		update_state_list();

		if (m_torrent_file->is_valid())
		{
			init();
		}
		else
		{
			// we need to start announcing since we don't have any
			// metadata. To receive peers to ask for it.
			set_state(torrent_status::downloading_metadata);
			start_announcing();
		}

#if TORRENT_USE_INVARIANT_CHECKS
		check_invariant();
#endif
	}